

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsDomainAddOrientation
              (FmsDomain domain,FmsEntityType type,FmsInt ent_id,FmsInt loc_side_id,
              FmsOrientation side_orient)

{
  FmsOrientation *orientations;
  FmsInt num_sides;
  FmsOrientation side_orient_local;
  FmsInt loc_side_id_local;
  FmsInt ent_id_local;
  FmsEntityType type_local;
  FmsDomain domain_local;
  int local_4;
  
  if (domain == (FmsDomain)0x0) {
    local_4 = 1;
  }
  else if ((type == FMS_VERTEX) || (FMS_PYRAMID < type)) {
    local_4 = 2;
  }
  else if (ent_id < domain->entities_caps[type]) {
    if (loc_side_id < FmsEntityNumSides[type]) {
      domain->orientations[type][ent_id * FmsEntityNumSides[type] + loc_side_id] = side_orient;
      local_4 = 0;
    }
    else {
      local_4 = 4;
    }
  }
  else {
    local_4 = 3;
  }
  return local_4;
}

Assistant:

int FmsDomainAddOrientation(FmsDomain domain, FmsEntityType type, FmsInt ent_id,
                            FmsInt loc_side_id, FmsOrientation side_orient) {
  if (!domain) { E_RETURN(1); }
  if (type == FMS_VERTEX || type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(2); }
  if (ent_id >= domain->entities_caps[type]) { E_RETURN(3); }
  const FmsInt num_sides = FmsEntityNumSides[type];
  if (loc_side_id >= num_sides) { E_RETURN(4); }
  FmsOrientation *orientations = domain->orientations[type];
  orientations[ent_id*num_sides + loc_side_id] = side_orient;
  return 0;
}